

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall boost::python::list::append<short>(list *this,short *x)

{
  list_base *in_RDI;
  object *this_00;
  object local_18 [3];
  
  this_00 = local_18;
  api::object::object<short>(this_00,(short *)in_RDI);
  detail::list_base::append(in_RDI,this_00);
  api::object::~object((object *)0x3a0585);
  return;
}

Assistant:

void append(T const& x)
    {
        base::append(object(x));
    }